

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

String __thiscall
testing::PrintTestPartResultToString(testing *this,TestPartResult *test_part_result)

{
  testing *this_00;
  TestPartResult *pTVar1;
  size_t sVar2;
  char *pcVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  Message MVar8;
  String SVar9;
  char local_59;
  Message local_58;
  testing *local_50;
  TestPartResult *local_48;
  void *local_40;
  long local_38;
  size_t sVar4;
  
  Message::Message(&local_58);
  pcVar6 = (test_part_result->file_name_).c_str_;
  pcVar3 = "unknown file";
  if (pcVar6 != (char *)0x0) {
    pcVar3 = pcVar6;
  }
  if (test_part_result->line_number_ < 0) {
    internal::String::Format((char *)&local_40,"%s:",pcVar3);
  }
  else {
    internal::String::Format((char *)&local_40,"%s:%d:",pcVar3);
  }
  poVar5 = (ostream *)(local_58.ss_ + 0x10);
  if (local_58.ss_ == (StrStream *)0x0) {
    poVar5 = (ostream *)0x0;
  }
  local_50 = this;
  local_48 = test_part_result;
  if (local_40 == (void *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(null)",6);
  }
  else if (local_38 != 0) {
    lVar7 = 0;
    do {
      if (*(char *)((long)local_40 + lVar7) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
      }
      else {
        local_59 = *(char *)((long)local_40 + lVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_59,1);
      }
      lVar7 = lVar7 + 1;
    } while (local_38 != lVar7);
  }
  poVar5 = (ostream *)(local_58.ss_ + 0x10);
  if (local_58.ss_ == (StrStream *)0x0) {
    poVar5 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  pTVar1 = local_48;
  if ((ulong)local_48->type_ < 3) {
    pcVar6 = &DAT_001719c4 + *(int *)(&DAT_001719c4 + (ulong)local_48->type_ * 4);
  }
  else {
    pcVar6 = "Unknown result type";
  }
  poVar5 = (ostream *)(local_58.ss_ + 0x10);
  if (local_58.ss_ == (StrStream *)0x0) {
    poVar5 = (ostream *)0x0;
  }
  sVar2 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar2);
  this_00 = local_50;
  pcVar6 = (pTVar1->message_).c_str_;
  if (pcVar6 == (char *)0x0) {
    MVar8.ss_ = local_58.ss_ + 0x10;
    sVar2 = 6;
    pcVar6 = "(null)";
  }
  else {
    MVar8.ss_ = local_58.ss_;
    if (local_58.ss_ != (StrStream *)0x0) {
      MVar8.ss_ = (StrStream *)(local_58.ss_ + 0x10);
    }
    sVar2 = strlen(pcVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar8.ss_,pcVar6,sVar2);
  SVar9 = internal::StrStreamToString((internal *)this_00,local_58.ss_);
  sVar4 = SVar9.length_;
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
    sVar4 = extraout_RDX;
  }
  if (local_58.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)local_58.ss_ + 8))();
    sVar4 = extraout_RDX_00;
  }
  SVar9.length_ = sVar4;
  SVar9.c_str_ = (char *)this_00;
  return SVar9;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}